

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

EndTerm * new_end_term(Token *op,void *expr)

{
  void *any;
  EndTerm *pEVar1;
  TreeNode *pTVar2;
  EndTerm *term;
  void *expr_local;
  Token *op_local;
  
  any = malloc(0x18);
  pEVar1 = (EndTerm *)require_not_null(any,"Failed to allocate space");
  pTVar2 = new_tree_node((Token *)0x0,end_eval);
  (pEVar1->node).eval = pTVar2->eval;
  (pEVar1->node).token = pTVar2->token;
  pEVar1->expr = expr;
  return pEVar1;
}

Assistant:

EndTerm *new_end_term(Token *op, void *expr) {
    EndTerm *term = new(EndTerm);
    term->node = tree_node_(NULL, eval_handler(end_eval));
    term->expr = expr;
    return term;
}